

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O1

Pdr_Set_t * Pdr_SetCreateSubset(Pdr_Set_t *pSet,int *pLits,int nLits)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  int iVar5;
  Pdr_Set_t *pPVar6;
  long lVar7;
  Pdr_Set_t *pPVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  
  if (-1 < nLits) {
    uVar1 = pSet->nLits;
    if (nLits <= (int)uVar1) {
      iVar2 = pSet->nTotal;
      iVar5 = (nLits - uVar1) + iVar2;
      pPVar6 = (Pdr_Set_t *)malloc((long)iVar5 * 4 + 0x18);
      pPVar6->nLits = nLits;
      pPVar6->nTotal = iVar5;
      pPVar6->nRefs = 1;
      pPVar6->Sign = 0;
      if (nLits == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        do {
          uVar3 = pLits[uVar10];
          if ((int)uVar3 < 0) {
            __assert_fail("pLits[i] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                          ,0x90,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
          }
          *(uint *)(&pPVar6->field_0x14 + uVar10 * 4) = uVar3;
          uVar10 = uVar10 + 1;
          pPVar6->Sign = pPVar6->Sign | 1L << ((char)(uVar3 / 0x3f) + (char)uVar3 & 0x3fU);
        } while ((uint)nLits != uVar10);
      }
      iVar9 = (int)uVar10;
      iVar5 = pPVar6->nLits;
      lVar7 = (long)iVar5;
      if (1 < lVar7) {
        pPVar8 = pPVar6 + 1;
        iVar11 = 1;
        uVar12 = 0;
        do {
          lVar7 = lVar7 + -1;
          lVar13 = 0;
          uVar14 = uVar12 & 0xffffffff;
          do {
            if (*(int *)((long)&pPVar8->Sign + lVar13 * 4) <
                *(int *)(&pPVar6->field_0x14 + (long)(int)uVar14 * 4)) {
              uVar14 = (ulong)(uint)(iVar11 + (int)lVar13);
            }
            lVar13 = lVar13 + 1;
          } while (lVar7 != lVar13);
          uVar4 = *(undefined4 *)(&pPVar6->field_0x14 + uVar12 * 4);
          *(undefined4 *)(&pPVar6->field_0x14 + uVar12 * 4) =
               *(undefined4 *)(&pPVar6->field_0x14 + (long)(int)uVar14 * 4);
          uVar12 = uVar12 + 1;
          *(undefined4 *)(&pPVar6->field_0x14 + (long)(int)uVar14 * 4) = uVar4;
          iVar11 = iVar11 + 1;
          pPVar8 = (Pdr_Set_t *)((long)&pPVar8->Sign + 4);
        } while (uVar12 != iVar5 - 1);
      }
      if ((int)uVar1 < iVar2) {
        memcpy(&pPVar6->field_0x14 + (uVar10 & 0xffffffff) * 4,
               &pSet->field_0x14 + (long)(int)uVar1 * 4,(ulong)(~uVar1 + iVar2) * 4 + 4);
        lVar7 = 0;
        do {
          lVar7 = lVar7 + -1;
        } while ((long)(int)uVar1 - (long)iVar2 != lVar7);
        iVar9 = iVar9 - (int)lVar7;
      }
      if (iVar9 != pPVar6->nTotal) {
        __assert_fail("k == p->nTotal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                      ,0x97,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
      }
      return pPVar6;
    }
  }
  __assert_fail("nLits >= 0 && nLits <= pSet->nLits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                ,0x88,"Pdr_Set_t *Pdr_SetCreateSubset(Pdr_Set_t *, int *, int)");
}

Assistant:

Pdr_Set_t * Pdr_SetCreateSubset( Pdr_Set_t * pSet, int * pLits, int nLits )
{
    Pdr_Set_t * p;
    int i, k = 0;
    assert( nLits >= 0 && nLits <= pSet->nLits );
    p = (Pdr_Set_t *)ABC_ALLOC( char, sizeof(Pdr_Set_t) + (nLits + pSet->nTotal - pSet->nLits) * sizeof(int) );
    p->nLits  = nLits;
    p->nTotal = nLits + pSet->nTotal - pSet->nLits;
    p->nRefs  = 1;
    p->Sign   = 0;
    for ( i = 0; i < nLits; i++ )
    {
        assert( pLits[i] >= 0 );
        p->Lits[k++] = pLits[i];
        p->Sign   |= ((word)1 << (pLits[i] % 63));
    }
    Vec_IntSelectSort( p->Lits, p->nLits );
    for ( i = pSet->nLits; i < pSet->nTotal; i++ )
        p->Lits[k++] = pSet->Lits[i];
    assert( k == p->nTotal );
    return p;
}